

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# complex_fft.c
# Opt level: O0

int WebRtcSpl_ComplexIFFT(int16_t *frfi,int stages,int mode)

{
  short sVar1;
  short sVar2;
  short sVar3;
  short sVar4;
  int16_t iVar5;
  int iVar6;
  int iVar7;
  ulong uVar8;
  size_t sVar9;
  long lVar10;
  int local_78;
  int32_t round2;
  int32_t tmp32;
  int32_t qi32;
  int32_t qr32;
  int32_t ti32;
  int32_t tr32;
  int16_t wi;
  int16_t wr;
  int shift;
  int scale;
  int k;
  size_t m;
  size_t n;
  size_t istep;
  size_t l;
  size_t j;
  size_t i;
  int mode_local;
  int stages_local;
  int16_t *frfi_local;
  
  uVar8 = (ulong)(1 << ((byte)stages & 0x1f));
  if (uVar8 < 0x401) {
    _wi = 0;
    istep = 1;
    shift = 9;
    while (istep < uVar8) {
      local_78 = 0x2000;
      iVar5 = (*WebRtcSpl_MaxAbsValueW16)(frfi,uVar8 << 1);
      tr32._0_1_ = 0x3505 < iVar5;
      if ((bool)(sbyte)tr32) {
        _wi = _wi + 1;
        local_78 = 0x4000;
      }
      if (0x6a0a < iVar5) {
        tr32._0_1_ = (sbyte)tr32 + 1;
        _wi = _wi + 1;
        local_78 = local_78 << 1;
      }
      sVar9 = istep * 2;
      if (mode == 0) {
        for (_scale = 0; _scale < istep; _scale = _scale + 1) {
          lVar10 = _scale << ((byte)shift & 0x3f);
          sVar1 = kSinTable1024[lVar10 + 0x100];
          sVar2 = kSinTable1024[lVar10];
          for (j = _scale; j < uVar8; j = sVar9 + j) {
            lVar10 = j + istep;
            iVar6 = (int)sVar1 * (int)frfi[lVar10 * 2] - (int)sVar2 * (int)frfi[lVar10 * 2 + 1] >>
                    0xf;
            iVar7 = (int)sVar1 * (int)frfi[lVar10 * 2 + 1] + (int)sVar2 * (int)frfi[lVar10 * 2] >>
                    0xf;
            sVar3 = frfi[j * 2];
            sVar4 = frfi[j * 2 + 1];
            frfi[lVar10 * 2] = (int16_t)(sVar3 - iVar6 >> (sbyte)tr32);
            frfi[lVar10 * 2 + 1] = (int16_t)(sVar4 - iVar7 >> (sbyte)tr32);
            frfi[j * 2] = (int16_t)(sVar3 + iVar6 >> (sbyte)tr32);
            frfi[j * 2 + 1] = (int16_t)(sVar4 + iVar7 >> (sbyte)tr32);
          }
        }
      }
      else {
        for (_scale = 0; _scale < istep; _scale = _scale + 1) {
          lVar10 = _scale << ((byte)shift & 0x3f);
          sVar1 = kSinTable1024[lVar10 + 0x100];
          sVar2 = kSinTable1024[lVar10];
          for (j = _scale; j < uVar8; j = sVar9 + j) {
            lVar10 = j + istep;
            iVar6 = ((int)sVar1 * (int)frfi[lVar10 * 2] - (int)sVar2 * (int)frfi[lVar10 * 2 + 1]) +
                    1 >> 1;
            iVar7 = (int)sVar1 * (int)frfi[lVar10 * 2 + 1] + (int)sVar2 * (int)frfi[lVar10 * 2] + 1
                    >> 1;
            sVar3 = frfi[j * 2];
            sVar4 = frfi[j * 2 + 1];
            frfi[lVar10 * 2] = (int16_t)((sVar3 * 0x4000 - iVar6) + local_78 >> (sbyte)tr32 + 0xe);
            frfi[lVar10 * 2 + 1] =
                 (int16_t)((sVar4 * 0x4000 - iVar7) + local_78 >> (sbyte)tr32 + 0xe);
            frfi[j * 2] = (int16_t)(sVar3 * 0x4000 + iVar6 + local_78 >> (sbyte)tr32 + 0xe);
            frfi[j * 2 + 1] = (int16_t)(sVar4 * 0x4000 + iVar7 + local_78 >> (sbyte)tr32 + 0xe);
          }
        }
      }
      shift = shift + -1;
      istep = sVar9;
    }
    frfi_local._4_4_ = _wi;
  }
  else {
    frfi_local._4_4_ = -1;
  }
  return frfi_local._4_4_;
}

Assistant:

int WebRtcSpl_ComplexIFFT(int16_t frfi[], int stages, int mode)
{
    size_t i, j, l, istep, n, m;
    int k, scale, shift;
    int16_t wr, wi;
    int32_t tr32, ti32, qr32, qi32;
    int32_t tmp32, round2;

    /* The 1024-value is a constant given from the size of kSinTable1024[],
     * and should not be changed depending on the input parameter 'stages'
     */
    n = 1 << stages;
    if (n > 1024)
        return -1;

    scale = 0;

    l = 1;
    k = 10 - 1; /* Constant for given kSinTable1024[]. Do not change
         depending on the input parameter 'stages' */

    while (l < n)
    {
        // variable scaling, depending upon data
        shift = 0;
        round2 = 8192;

        tmp32 = WebRtcSpl_MaxAbsValueW16(frfi, 2 * n);
        if (tmp32 > 13573)
        {
            shift++;
            scale++;
            round2 <<= 1;
        }
        if (tmp32 > 27146)
        {
            shift++;
            scale++;
            round2 <<= 1;
        }

        istep = l << 1;

        if (mode == 0)
        {
            // mode==0: Low-complexity and Low-accuracy mode
            for (m = 0; m < l; ++m)
            {
                j = m << k;

                /* The 256-value is a constant given as 1/4 of the size of
                 * kSinTable1024[], and should not be changed depending on the input
                 * parameter 'stages'. It will result in 0 <= j < N_SINE_WAVE/2
                 */
                wr = kSinTable1024[j + 256];
                wi = kSinTable1024[j];

                for (i = m; i < n; i += istep)
                {
                    j = i + l;

                    tr32 = (wr * frfi[2 * j] - wi * frfi[2 * j + 1]) >> 15;

                    ti32 = (wr * frfi[2 * j + 1] + wi * frfi[2 * j]) >> 15;

                    qr32 = (int32_t)frfi[2 * i];
                    qi32 = (int32_t)frfi[2 * i + 1];
                    frfi[2 * j] = (int16_t)((qr32 - tr32) >> shift);
                    frfi[2 * j + 1] = (int16_t)((qi32 - ti32) >> shift);
                    frfi[2 * i] = (int16_t)((qr32 + tr32) >> shift);
                    frfi[2 * i + 1] = (int16_t)((qi32 + ti32) >> shift);
                }
            }
        } else
        {
            // mode==1: High-complexity and High-accuracy mode

            for (m = 0; m < l; ++m)
            {
                j = m << k;

                /* The 256-value is a constant given as 1/4 of the size of
                 * kSinTable1024[], and should not be changed depending on the input
                 * parameter 'stages'. It will result in 0 <= j < N_SINE_WAVE/2
                 */
                wr = kSinTable1024[j + 256];
                wi = kSinTable1024[j];

#ifdef WEBRTC_ARCH_ARM_V7
                int32_t wri = 0;
                __asm __volatile("pkhbt %0, %1, %2, lsl #16" : "=r"(wri) :
                    "r"((int32_t)wr), "r"((int32_t)wi));
#endif

                for (i = m; i < n; i += istep)
                {
                    j = i + l;

#ifdef WEBRTC_ARCH_ARM_V7
                    register int32_t frfi_r;
                    __asm __volatile(
                      "pkhbt %[frfi_r], %[frfi_even], %[frfi_odd], lsl #16\n\t"
                      "smlsd %[tr32], %[wri], %[frfi_r], %[cifftrnd]\n\t"
                      "smladx %[ti32], %[wri], %[frfi_r], %[cifftrnd]\n\t"
                      :[frfi_r]"=&r"(frfi_r),
                       [tr32]"=&r"(tr32),
                       [ti32]"=r"(ti32)
                      :[frfi_even]"r"((int32_t)frfi[2*j]),
                       [frfi_odd]"r"((int32_t)frfi[2*j +1]),
                       [wri]"r"(wri),
                       [cifftrnd]"r"(CIFFTRND)
                    );
#else

                    tr32 = wr * frfi[2 * j] - wi * frfi[2 * j + 1] + CIFFTRND;

                    ti32 = wr * frfi[2 * j + 1] + wi * frfi[2 * j] + CIFFTRND;
#endif
                    tr32 >>= 15 - CIFFTSFT;
                    ti32 >>= 15 - CIFFTSFT;

                    qr32 = ((int32_t)frfi[2 * i]) << CIFFTSFT;
                    qi32 = ((int32_t)frfi[2 * i + 1]) << CIFFTSFT;

                    frfi[2 * j] = (int16_t)(
                        (qr32 - tr32 + round2) >> (shift + CIFFTSFT));
                    frfi[2 * j + 1] = (int16_t)(
                        (qi32 - ti32 + round2) >> (shift + CIFFTSFT));
                    frfi[2 * i] = (int16_t)(
                        (qr32 + tr32 + round2) >> (shift + CIFFTSFT));
                    frfi[2 * i + 1] = (int16_t)(
                        (qi32 + ti32 + round2) >> (shift + CIFFTSFT));
                }
            }

        }
        --k;
        l = istep;
    }
    return scale;
}